

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::String&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,String *params)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar11;
  uchar *puVar12;
  long lVar13;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar14;
  long lVar15;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  ulong targetSize;
  uchar *puVar16;
  char *__s1;
  long *in_R9;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar17;
  ArrayPtr<const_unsigned_char> s_00;
  Maybe<unsigned_long> MVar18;
  char *local_50;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  uVar6 = *(long *)(this_00 + 0x18) * 2;
  if (uVar6 < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar6) {
      targetSize = uVar6;
    }
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,targetSize);
  }
  puVar2 = (uchar *)in_R9[1];
  puVar16 = puVar2;
  if (puVar2 != (uchar *)0x0) {
    puVar16 = (uchar *)*in_R9;
  }
  puVar12 = puVar2 + -1;
  if (puVar2 == (uchar *)0x0) {
    puVar12 = (uchar *)0x0;
  }
  s_00.size_ = (size_t)puVar12;
  s_00.ptr = puVar16;
  uVar7 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
  uVar8 = _::chooseBucket((uint)(uVar7 != 0),*(uint *)(this_00 + 0x18));
  lVar3 = in_R9[1];
  local_50 = "";
  if (lVar3 != 0) {
    local_50 = (char *)*in_R9;
  }
  lVar4 = *(long *)(this_00 + 0x10);
  lVar5 = *(long *)(this_00 + 0x18);
  paVar17 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar11 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (lVar4 + (ulong)uVar8 * 8);
    uVar1 = *(uint *)((long)paVar11 + 4);
    if (uVar1 == 1) {
      if (paVar17 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar17 = paVar11;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar17 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          paVar11 = paVar17;
        }
        aVar14.value = ((ulong)(uVar7 != 0) | (long)params << 0x20) + 0x200000000;
        paVar11->value = (unsigned_long)aVar14;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
        goto LAB_0015bfbd;
      }
      if (*(uint *)paVar11 == (uint)(uVar7 != 0)) {
        lVar10 = (ulong)(uVar1 - 2) * 0x20;
        lVar15 = *(long *)(table.size_ + 8 + lVar10);
        lVar13 = lVar15 + (ulong)(lVar15 == 0);
        if (lVar13 == lVar3 + (ulong)(lVar3 == 0)) {
          __s1 = "";
          if (lVar15 != 0) {
            __s1 = *(char **)(lVar10 + table.size_);
          }
          iVar9 = bcmp(__s1,local_50,lVar13 - 1);
          if (iVar9 == 0) {
            *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
            *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
            aVar14 = extraout_RDX;
LAB_0015bfbd:
            MVar18.ptr.field_1.value = aVar14.value;
            MVar18.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar18.ptr;
          }
        }
      }
    }
    lVar15 = (ulong)uVar8 + 1;
    uVar8 = (uint)lVar15;
    if (lVar15 == lVar5) {
      uVar8 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }